

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

void __thiscall
capnp::_::anon_unknown_0::RpcConnectionState::RpcPipeline::RpcPipeline
          (RpcPipeline *this,RpcConnectionState *connectionState,
          Own<capnp::_::(anonymous_namespace)::RpcConnectionState::QuestionRef> *questionRef)

{
  Own<capnp::_::(anonymous_namespace)::RpcConnectionState::QuestionRef> *params;
  Own<capnp::_::(anonymous_namespace)::RpcConnectionState::QuestionRef> *questionRef_local;
  RpcConnectionState *connectionState_local;
  RpcPipeline *this_local;
  
  PipelineHook::PipelineHook(&this->super_PipelineHook);
  kj::Refcounted::Refcounted(&this->super_Refcounted);
  (this->super_PipelineHook)._vptr_PipelineHook = (_func_int **)&PTR_addRef_00cd44b0;
  (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)&DAT_00cd44e8;
  kj::addRef<capnp::_::(anonymous_namespace)::RpcConnectionState>
            ((kj *)&this->connectionState,connectionState);
  kj::
  Maybe<kj::ForkedPromise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>_>
  ::Maybe(&this->redirectLater);
  kj::
  OneOf<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::QuestionRef>,_kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>,_kj::Exception>
  ::OneOf(&this->state);
  kj::Promise<void>::Promise(&this->resolveSelfPromise,(void *)0x0);
  params = kj::mv<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::QuestionRef>>
                     (questionRef);
  kj::
  OneOf<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::QuestionRef>,kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>,kj::Exception>
  ::
  init<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::QuestionRef>,kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::QuestionRef>>
            ((OneOf<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::QuestionRef>,kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>,kj::Exception>
              *)&this->state,params);
  return;
}

Assistant:

RpcPipeline(RpcConnectionState& connectionState, kj::Own<QuestionRef>&& questionRef)
        : connectionState(kj::addRef(connectionState)),
          resolveSelfPromise(nullptr) {
      // Construct a new RpcPipeline that is never expected to resolve.

      state.init<Waiting>(kj::mv(questionRef));
    }